

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall minja::VariableExpr::VariableExpr(VariableExpr *this,Location *location,string *n)

{
  string *in_RDX;
  Expression *in_RDI;
  Location *in_stack_ffffffffffffffc8;
  
  Expression::Expression(in_RDI,in_stack_ffffffffffffffc8);
  in_RDI->_vptr_Expression = (_func_int **)&PTR_do_evaluate_00486240;
  std::__cxx11::string::string((string *)(in_RDI + 1),in_RDX);
  return;
}

Assistant:

VariableExpr(const Location & location, const std::string& n)
      : Expression(location), name(n) {}